

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_convolution_add(NetOptimize *this)

{
  int iVar1;
  uint _w;
  uint uVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  int *piVar5;
  pointer ppLVar6;
  Layer *pLVar7;
  Layer *pLVar8;
  long lVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong local_88;
  undefined1 local_78 [48];
  size_type sStack_48;
  int local_40;
  size_t local_38;
  
  pvVar3 = (this->super_ModelWriter).layers;
  uVar13 = (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_88 = 1;
  uVar15 = 0;
  while( true ) {
    if (uVar15 == uVar13) {
      return 0;
    }
    bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar15]->type,"Convolution");
    if (!bVar10) break;
LAB_00161e78:
    uVar15 = uVar15 + 1;
    local_88 = local_88 + 1;
  }
  iVar1 = *((((this->super_ModelWriter).layers)->
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar15]->tops).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  uVar14 = local_88;
LAB_00161e9c:
  if (uVar14 < uVar13) {
    bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar14]->type,"BinaryOp");
    if (((bVar10) ||
        (pLVar4 = (((this->super_ModelWriter).layers)->
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar14],
        piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        (long)(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)piVar5 != 8)) || (*piVar5 != iVar1))
    goto LAB_00161edd;
    if (uVar13 != uVar14) {
      ppLVar6 = (((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pLVar4 = ppLVar6[uVar14];
      if ((*(int *)&pLVar4[1]._vptr_Layer == 0) && (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 0)
         ) {
        pLVar7 = ppLVar6[uVar15];
        uVar12 = uVar14;
        if (uVar13 < uVar14) {
          uVar12 = uVar13;
        }
        uVar16 = 0;
        while ((uVar11 = uVar12, uVar12 != uVar16 &&
               ((bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar16]->type,
                                          "MemoryData"), bVar10 ||
                (uVar11 = uVar16,
                *((((this->super_ModelWriter).layers)->
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar16]->tops).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start !=
                *(int *)(*(long *)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + 4)))))) {
          uVar16 = uVar16 + 1;
        }
        if (uVar11 != uVar14) {
          pLVar8 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
          _w = *(uint *)&pLVar7[1]._vptr_Layer;
          uVar14 = (ulong)_w;
          if ((*(uint *)&pLVar8[1]._vptr_Layer == _w) &&
             (*(int *)((long)&pLVar8[1]._vptr_Layer + 4) == 0)) {
            iVar1._0_1_ = pLVar8[1].support_bf16_storage;
            iVar1._1_1_ = pLVar8[1].support_fp16_storage;
            iVar1._2_1_ = pLVar8[1].support_int8_storage;
            iVar1._3_1_ = pLVar8[1].support_image_storage;
            bVar10 = iVar1 == 0;
          }
          else {
            bVar10 = false;
          }
          if ((*(uint *)&pLVar8[1]._vptr_Layer == 1) &&
             (*(int *)((long)&pLVar8[1]._vptr_Layer + 4) == 1)) {
            uVar2._0_1_ = pLVar8[1].support_bf16_storage;
            uVar2._1_1_ = pLVar8[1].support_fp16_storage;
            uVar2._2_1_ = pLVar8[1].support_int8_storage;
            uVar2._3_1_ = pLVar8[1].support_image_storage;
            if (uVar2 == _w || bVar10) {
LAB_00161feb:
              fprintf(_stderr,"fuse_convolution_add %s %s\n",(pLVar7->name)._M_dataplus._M_p);
              ncnn::Mat::reshape((Mat *)local_78,(Mat *)&pLVar8[1].support_tensor_storage,_w,
                                 (Allocator *)0x0);
              if (*(int *)&pLVar7[1].type._M_dataplus._M_p == 0) {
                *(undefined4 *)&pLVar7[1].type._M_dataplus._M_p = 1;
                if ((Mat *)&pLVar7[2].one_blob_only != (Mat *)local_78) {
                  if ((int *)local_78._8_8_ != (int *)0x0) {
                    LOCK();
                    *(int *)local_78._8_8_ = *(int *)local_78._8_8_ + 1;
                    UNLOCK();
                  }
                  piVar5 = *(int **)&pLVar7[2].support_tensor_storage;
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (*(long **)&pLVar7[2].typeindex == (long *)0x0) {
                        free(*(void **)&pLVar7[2].one_blob_only);
                      }
                      else {
                        (**(code **)(**(long **)&pLVar7[2].typeindex + 0x18))();
                      }
                    }
                  }
                  pLVar7[2].one_blob_only = (bool)local_78[0];
                  pLVar7[2].support_inplace = (bool)local_78[1];
                  pLVar7[2].support_vulkan = (bool)local_78[2];
                  pLVar7[2].support_packing = (bool)local_78[3];
                  pLVar7[2].support_bf16_storage = (bool)local_78[4];
                  pLVar7[2].support_fp16_storage = (bool)local_78[5];
                  pLVar7[2].support_int8_storage = (bool)local_78[6];
                  pLVar7[2].support_image_storage = (bool)local_78[7];
                  pLVar7[2].support_tensor_storage = (bool)local_78[8];
                  pLVar7[2].support_reserved_00 = (bool)local_78[9];
                  pLVar7[2].support_reserved_0 = (bool)local_78[10];
                  pLVar7[2].support_reserved_1 = (bool)local_78[0xb];
                  pLVar7[2].support_reserved_2 = (bool)local_78[0xc];
                  pLVar7[2].support_reserved_3 = (bool)local_78[0xd];
                  pLVar7[2].support_reserved_4 = (bool)local_78[0xe];
                  pLVar7[2].support_reserved_5 = (bool)local_78[0xf];
                  pLVar7[2].support_reserved_6 = (bool)local_78[0x10];
                  pLVar7[2].support_reserved_7 = (bool)local_78[0x11];
                  pLVar7[2].support_reserved_8 = (bool)local_78[0x12];
                  pLVar7[2].support_reserved_9 = (bool)local_78[0x13];
                  pLVar7[2].support_reserved_10 = (bool)local_78[0x14];
                  pLVar7[2].support_reserved_11 = (bool)local_78[0x15];
                  pLVar7[2].support_reserved_12 = (bool)local_78[0x16];
                  pLVar7[2].support_reserved_13 = (bool)local_78[0x17];
                  *(undefined4 *)&pLVar7[2].userdata = local_78._24_4_;
                  *(undefined8 *)&pLVar7[2].typeindex = local_78._32_8_;
                  pLVar7[2].type._M_dataplus._M_p = (pointer)local_78._40_8_;
                  pLVar7[2].type._M_string_length = sStack_48;
                  *(int *)&pLVar7[2].type.field_2 = local_40;
                  *(size_t *)((long)&pLVar7[2].type.field_2 + 8) = local_38;
                }
              }
              else {
                lVar9 = *(long *)&pLVar7[2].one_blob_only;
                if ((int)_w < 1) {
                  uVar14 = 0;
                }
                for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
                  *(float *)(lVar9 + uVar12 * 4) =
                       *(float *)(lVar9 + uVar12 * 4) + *(float *)(local_78._0_8_ + uVar12 * 4);
                }
              }
              iVar1 = *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              *(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start = iVar1;
              (((this->super_ModelWriter).blobs)->
              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar1].producer = (int)uVar15;
              std::__cxx11::string::assign((char *)&pLVar4->type);
              if ((int *)local_78._8_8_ != (int *)0x0) {
                LOCK();
                *(int *)local_78._8_8_ = *(int *)local_78._8_8_ + -1;
                UNLOCK();
                if (*(int *)local_78._8_8_ == 0) {
                  if ((Allocator *)local_78._32_8_ == (Allocator *)0x0) {
                    free((void *)local_78._0_8_);
                  }
                  else {
                    (*(*(_func_int ***)local_78._32_8_)[3])();
                  }
                }
              }
            }
          }
          else if (bVar10) goto LAB_00161feb;
        }
      }
    }
  }
  goto LAB_00161e78;
LAB_00161edd:
  uVar14 = uVar14 + 1;
  goto LAB_00161e9c;
}

Assistant:

int NetOptimize::fuse_convolution_add()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution")
            continue;

        // Convolution - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Convolution - BinaryOp to Convolution
        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 0 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = convolution->num_output;

        bool broadcasting_type_ok = false;
        if (memorydata->w == channels && memorydata->h == 0 && memorydata->c == 0)
            broadcasting_type_ok = true;
        if (memorydata->w == 1 && memorydata->h == 1 && memorydata->c == channels)
            broadcasting_type_ok = true;

        if (!broadcasting_type_ok)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_convolution_add %s %s\n", convolution->name.c_str(), binaryop->name.c_str());

        ncnn::Mat bias_data = memorydata->data.reshape(channels);
        {
            if (convolution->bias_term == 0)
            {
                // init bias
                convolution->bias_term = 1;
                convolution->bias_data = bias_data;
            }
            else
            {
                float* bias = convolution->bias_data;
                for (int i = 0; i < channels; i++)
                {
                    bias[i] = bias[i] + bias_data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        convolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}